

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcEdgeLogLikelihoodsMulti
          (BeagleCPUImpl<float,_1,_0> *this,int *parentBufferIndices,int *childBufferIndices,
          int *probabilityIndices,int *categoryWeightsIndices,int *stateFrequenciesIndices,
          int *scalingFactorsIndices,int count,double *outSumLogLikelihood)

{
  float *pfVar1;
  float fVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  float **ppfVar9;
  double *pdVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  float *pfVar16;
  ulong uVar17;
  ulong uVar18;
  float *pfVar19;
  ulong uVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  long lVar24;
  long lVar25;
  int iVar26;
  float *pfVar27;
  long lVar28;
  float fVar29;
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [64];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined8 in_XMM6_Qb;
  vector<float,_std::allocator<float>_> maxScaleFactor;
  vector<int,_std::allocator<int>_> indexMaxScale;
  allocator_type local_119;
  ulong local_118;
  ulong local_110;
  float *local_108;
  float *local_100;
  ulong local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  int local_d4;
  BeagleCPUImpl<float,_1,_0> *local_d0;
  float *local_c8;
  float *local_c0;
  int *local_b8;
  int *local_b0;
  int *local_a8;
  int *local_a0;
  int *local_98;
  float *local_90;
  float *local_88;
  ulong local_80;
  long local_78;
  long local_70;
  ulong local_68;
  vector<float,_std::allocator<float>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  
  local_b8 = parentBufferIndices;
  local_b0 = childBufferIndices;
  local_a8 = probabilityIndices;
  local_a0 = categoryWeightsIndices;
  local_98 = stateFrequenciesIndices;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_48,(long)this->kPatternCount,(allocator_type *)&local_60);
  std::vector<float,_std::allocator<float>_>::vector(&local_60,(long)this->kPatternCount,&local_119)
  ;
  uVar18 = (ulong)(uint)this->kPatternCount;
  if (0 < count) {
    local_80 = (ulong)(count - 1);
    local_118 = (ulong)(uint)count;
    uVar20 = 0;
    local_d0 = this;
    do {
      local_c0 = this->gPartials[local_b8[uVar20]];
      local_108 = this->gTransitionMatrices[local_a8[uVar20]];
      local_c8 = this->gCategoryWeights[local_a0[uVar20]];
      local_100 = this->gStateFrequencies[local_98[uVar20]];
      iVar26 = local_b0[uVar20];
      local_f8 = uVar20;
      memset(this->integrationTmp,0,(long)(int)uVar18 * (long)this->kStateCount * 4);
      uVar14 = local_118;
      if ((iVar26 < this->kTipCount) && (piVar8 = this->gTipStates[iVar26], piVar8 != (int *)0x0)) {
        local_f0 = (long)this->kCategoryCount;
        uVar4 = this->kPatternCount;
        uVar18 = (ulong)uVar4;
        if (0 < local_f0) {
          iVar26 = this->kMatrixSize;
          uVar5 = this->kStateCount;
          lVar24 = 0;
          iVar22 = 0;
          lVar25 = 0;
          local_110 = CONCAT44(local_110._4_4_,iVar26);
          iVar6 = this->kPartialsPaddedStateCount;
          do {
            if (0 < (int)uVar4) {
              local_e8 = CONCAT44(local_e8._4_4_,iVar22);
              iVar7 = this->kTransPaddedStateCount;
              pfVar16 = this->integrationTmp;
              lVar25 = (long)(int)lVar25;
              uVar20 = 0;
              fVar35 = local_c8[lVar24];
              pfVar19 = local_c0 + lVar25;
              iVar21 = 0;
              do {
                if (0 < (int)uVar5) {
                  pfVar27 = local_108 + (long)iVar22 + (long)piVar8[uVar20];
                  uVar17 = 0;
                  do {
                    fVar29 = *pfVar27;
                    pfVar27 = pfVar27 + iVar7;
                    auVar31 = vfmadd213ss_fma(ZEXT416((uint)(fVar29 * pfVar19[uVar17])),
                                              ZEXT416((uint)fVar35),
                                              ZEXT416((uint)pfVar16[(long)iVar21 + uVar17]));
                    pfVar16[(long)iVar21 + uVar17] = auVar31._0_4_;
                    uVar17 = uVar17 + 1;
                  } while (uVar5 != uVar17);
                  iVar21 = iVar21 + (int)uVar17;
                }
                lVar25 = lVar25 + iVar6;
                uVar20 = uVar20 + 1;
                pfVar19 = pfVar19 + iVar6;
                this = local_d0;
                local_e0 = lVar24;
              } while (uVar20 != uVar18);
            }
            iVar22 = iVar22 + iVar26;
            lVar24 = lVar24 + 1;
          } while (lVar24 != local_f0);
        }
      }
      else {
        local_78 = (long)this->kCategoryCount;
        uVar4 = this->kPatternCount;
        uVar18 = (ulong)uVar4;
        if (0 < local_78) {
          local_d4 = this->kMatrixSize;
          uVar5 = this->kStateCount;
          local_110 = 0;
          local_e8 = (long)this->kPartialsPaddedStateCount;
          local_88 = this->gPartials[iVar26];
          uVar15 = uVar5 + 3;
          if (-1 < (int)uVar5) {
            uVar15 = uVar5;
          }
          lVar25 = 0;
          local_f0 = local_e8 * 4;
          local_90 = local_88 + 2;
          lVar24 = 0;
          do {
            if (0 < (int)uVar4) {
              auVar31._0_8_ = (double)local_c8[lVar24];
              auVar31._8_8_ = in_XMM6_Qb;
              pfVar27 = this->integrationTmp;
              lVar25 = (long)(int)lVar25;
              uVar23 = 0;
              lVar28 = 0;
              pfVar19 = local_90 + lVar25;
              pfVar16 = local_88 + lVar25;
              do {
                if (0 < (int)uVar5) {
                  lVar28 = (long)(int)lVar28;
                  uVar17 = 0;
                  uVar20 = local_110;
                  do {
                    iVar26 = (int)uVar20;
                    if ((int)uVar5 < 4) {
                      auVar32 = ZEXT816(0);
                      uVar20 = 0;
                    }
                    else {
                      auVar32 = ZEXT816(0);
                      uVar20 = 0;
                      do {
                        lVar11 = (long)iVar26 + uVar20;
                        lVar12 = uVar20 - 2;
                        lVar13 = uVar20 + 2;
                        pfVar1 = pfVar19 + uVar20;
                        uVar20 = uVar20 + 4;
                        auVar36._0_4_ =
                             (float)*(undefined8 *)(local_108 + lVar11) *
                             (float)*(undefined8 *)(pfVar19 + lVar12);
                        auVar36._4_4_ =
                             (float)((ulong)*(undefined8 *)(local_108 + lVar11) >> 0x20) *
                             (float)((ulong)*(undefined8 *)(pfVar19 + lVar12) >> 0x20);
                        auVar36._8_8_ = 0;
                        auVar38._0_4_ =
                             (float)*(undefined8 *)(local_108 + iVar26 + lVar13) *
                             (float)*(undefined8 *)pfVar1;
                        auVar38._4_4_ =
                             (float)((ulong)*(undefined8 *)(local_108 + iVar26 + lVar13) >> 0x20) *
                             (float)((ulong)*(undefined8 *)pfVar1 >> 0x20);
                        auVar38._8_8_ = 0;
                        auVar36 = vcvtps2pd_avx(auVar36);
                        dVar30 = auVar32._8_8_;
                        auVar38 = vcvtps2pd_avx(auVar38);
                        auVar32._0_8_ = auVar32._0_8_ + auVar36._0_8_ + auVar38._0_8_;
                        auVar32._8_8_ = dVar30 + auVar36._8_8_ + auVar38._8_8_;
                      } while ((long)uVar20 < (long)(int)(uVar15 & 0xfffffffc));
                    }
                    auVar37 = ZEXT1664(auVar32);
                    dVar30 = auVar32._0_8_;
                    if ((int)uVar20 < (int)uVar5) {
                      uVar20 = uVar20 & 0xffffffff;
                      do {
                        lVar11 = (long)iVar26 + uVar20;
                        pfVar1 = pfVar16 + uVar20;
                        uVar20 = uVar20 + 1;
                        dVar30 = auVar37._0_8_ + (double)(local_108[lVar11] * *pfVar1);
                        auVar37 = ZEXT864((ulong)dVar30);
                      } while (uVar5 != uVar20);
                    }
                    lVar11 = lVar25 + uVar17;
                    auVar39._0_8_ = (double)pfVar27[lVar28];
                    auVar39._8_8_ = in_XMM6_Qb;
                    auVar32 = vshufpd_avx(auVar32,auVar32,1);
                    uVar17 = uVar17 + 1;
                    uVar20 = (ulong)(iVar26 + uVar5 + 1);
                    auVar33._8_8_ = 0;
                    auVar33._0_8_ = (auVar32._0_8_ + dVar30) * (double)local_c0[lVar11];
                    auVar32 = vfmadd231sd_fma(auVar39,auVar31,auVar33);
                    pfVar27[lVar28] = (float)auVar32._0_8_;
                    lVar28 = lVar28 + 1;
                    local_e0 = lVar25;
                  } while (uVar17 != uVar5);
                }
                lVar25 = lVar25 + local_e8;
                uVar23 = uVar23 + 1;
                pfVar19 = pfVar19 + local_e8;
                pfVar16 = pfVar16 + local_e8;
                this = local_d0;
                local_70 = lVar24;
              } while (uVar23 != uVar4);
            }
            lVar24 = lVar24 + 1;
            local_110 = (ulong)(uint)((int)local_110 + local_d4);
            local_68 = uVar18;
          } while (lVar24 != local_78);
        }
      }
      uVar20 = local_f8;
      if (0 < (int)uVar18) {
        lVar24 = 0;
        iVar26 = 0;
        pfVar19 = local_100;
        do {
          iVar6 = this->kStateCount;
          if ((long)iVar6 < 1) {
            auVar37 = ZEXT1664(ZEXT816(0));
          }
          else {
            auVar37 = ZEXT1664(ZEXT816(0));
            lVar25 = 0;
            do {
              auVar31 = vfmadd231ss_fma(auVar37._0_16_,ZEXT416((uint)pfVar19[lVar25]),
                                        ZEXT416((uint)this->integrationTmp[iVar26 + lVar25]));
              auVar37 = ZEXT1664(auVar31);
              lVar25 = lVar25 + 1;
            } while (iVar6 != lVar25);
            iVar26 = iVar26 + iVar6;
          }
          fVar35 = auVar37._0_4_;
          if (*scalingFactorsIndices != -1) {
            ppfVar9 = this->gScaleBuffers;
            pfVar16 = ppfVar9[scalingFactorsIndices[uVar20]];
            if (uVar20 == 0) {
              local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[lVar24] = 0;
              uVar18 = 0;
              fVar29 = pfVar16[lVar24];
              local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[lVar24] = fVar29;
              if (count != 1) {
                uVar17 = 1;
                uVar18 = 0;
                do {
                  fVar2 = ppfVar9[scalingFactorsIndices[uVar17]][lVar24];
                  if (fVar29 < fVar2) {
                    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar24] = (int)uVar17;
                    local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar24] = fVar2;
                    uVar18 = uVar17 & 0xffffffff;
                    fVar29 = fVar2;
                  }
                  uVar17 = uVar17 + 1;
                } while (uVar14 != uVar17);
              }
            }
            else {
              uVar18 = (ulong)(uint)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start[lVar24];
            }
            if (uVar20 != uVar18) {
              local_108 = (float *)CONCAT44(local_108._4_4_,fVar35);
              dVar30 = exp((double)(pfVar16[lVar24] -
                                   local_60.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start[lVar24]));
              fVar35 = (float)(dVar30 * (double)local_108._0_4_);
              uVar20 = local_f8;
              pfVar19 = local_100;
            }
          }
          pfVar16 = this->outLogLikelihoodsTmp;
          if (uVar20 == 0) {
            pfVar16[lVar24] = fVar35;
          }
          else {
            fVar35 = fVar35 + pfVar16[lVar24];
            if (uVar20 == local_80) {
              dVar30 = log((double)fVar35);
              pfVar16 = this->outLogLikelihoodsTmp;
              fVar35 = (float)dVar30;
              uVar20 = local_f8;
              pfVar19 = local_100;
            }
            pfVar16[lVar24] = fVar35;
          }
          uVar18 = (ulong)this->kPatternCount;
          lVar24 = lVar24 + 1;
        } while (lVar24 < (long)uVar18);
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 != uVar14);
  }
  if (*scalingFactorsIndices == -1) {
LAB_00138ce0:
    *outSumLogLikelihood = 0.0;
    if (0 < (int)uVar18) {
      pdVar10 = this->gPatternWeights;
      pfVar19 = this->outLogLikelihoodsTmp;
      auVar31 = ZEXT816(0) << 0x40;
      uVar20 = 0;
      do {
        auVar34._0_8_ = (double)pfVar19[uVar20];
        auVar34._8_8_ = in_XMM6_Qb;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = pdVar10[uVar20];
        auVar31 = vfmadd231sd_fma(auVar31,auVar34,auVar3);
        uVar20 = uVar20 + 1;
        dVar30 = auVar31._0_8_;
        *outSumLogLikelihood = dVar30;
      } while ((uVar18 & 0xffffffff) != uVar20);
      iVar26 = (uint)(!NAN(dVar30) && !NAN(dVar30)) * 8 + -8;
      goto LAB_00138d32;
    }
  }
  else {
    if (0 < (int)uVar18) {
      pfVar19 = this->outLogLikelihoodsTmp;
      uVar20 = 0;
      do {
        pfVar19[uVar20] =
             local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start[uVar20] + pfVar19[uVar20];
        uVar20 = uVar20 + 1;
      } while ((uVar18 & 0xffffffff) != uVar20);
      goto LAB_00138ce0;
    }
    *outSumLogLikelihood = 0.0;
  }
  iVar26 = 0;
LAB_00138d32:
  if (local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return iVar26;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoodsMulti(const int* parentBufferIndices,
                                                                   const int* childBufferIndices,
                                                                   const int* probabilityIndices,
                                                                   const int* categoryWeightsIndices,
                                                                   const int* stateFrequenciesIndices,
                                                                   const int* scalingFactorsIndices,
                                                                   int count,
                                                                   double* outSumLogLikelihood) {

    std::vector<int> indexMaxScale(kPatternCount);
    std::vector<REALTYPE> maxScaleFactor(kPatternCount);

    int returnCode = BEAGLE_SUCCESS;

    for (int subsetIndex = 0 ; subsetIndex < count; ++subsetIndex ) {
        const REALTYPE* partialsParent = gPartials[parentBufferIndices[subsetIndex]];
        const REALTYPE* transMatrix = gTransitionMatrices[probabilityIndices[subsetIndex]];
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndices[subsetIndex]];
        const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndices[subsetIndex]];
        int childIndex = childBufferIndices[subsetIndex];

        memset(integrationTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));

        if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child

            const int* statesChild = gTipStates[childIndex];
            int v = 0; // Index for parent partials

            for(int l = 0; l < kCategoryCount; l++) {
                int u = 0; // Index in resulting product-partials (summed over categories)
                const REALTYPE weight = wt[l];
                for(int k = 0; k < kPatternCount; k++) {

                    const int stateChild = statesChild[k];  // DISCUSSION PT: Does it make sense to change the order of the partials,
                    // so we can interchange the patterCount and categoryCount loop order?
                    int w =  l * kMatrixSize;
                    for(int i = 0; i < kStateCount; i++) {
                        integrationTmp[u] += transMatrix[w + stateChild] * partialsParent[v + i] * weight;
                        u++;

                        w += kTransPaddedStateCount;
                    }
                    v += kPartialsPaddedStateCount;
                }
            }
        } else {
            const REALTYPE* partialsChild = gPartials[childIndex];
            int v = 0;
            int stateCountModFour = (kStateCount / 4) * 4;

            for(int l = 0; l < kCategoryCount; l++) {
                int u = 0;
                const REALTYPE weight = wt[l];
                for(int k = 0; k < kPatternCount; k++) {
                    int w = l * kMatrixSize;
                    const REALTYPE* partialsChildPtr = &partialsChild[v];
                    for(int i = 0; i < kStateCount; i++) {
                        double sumOverJA = 0.0, sumOverJB = 0.0;
                        int j = 0;
                        const REALTYPE* transMatrixPtr = &transMatrix[w];
                        for (; j < stateCountModFour; j += 4) {
                            sumOverJA += transMatrixPtr[j + 0] * partialsChildPtr[j + 0];
                            sumOverJB += transMatrixPtr[j + 1] * partialsChildPtr[j + 1];
                            sumOverJA += transMatrixPtr[j + 2] * partialsChildPtr[j + 2];
                            sumOverJB += transMatrixPtr[j + 3] * partialsChildPtr[j + 3];

                        }
                        for (; j < kStateCount; j++) {
                            sumOverJA += transMatrixPtr[j] * partialsChildPtr[j];
                        }
//                        for(int j = 0; j < kStateCount; j++) {
//                            sumOverJ += transMatrix[w] * partialsChild[v + j];
//                            w++;
//                        }
                        integrationTmp[u] += (sumOverJA + sumOverJB) * partialsParent[v + i] * weight;
                        u++;

                        w += kStateCount;

                        // increment for the extra column at the end
                        w += T_PAD;
                    }
                    v += kPartialsPaddedStateCount;
                }
            }

        }
        int u = 0;
        for(int k = 0; k < kPatternCount; k++) {
            REALTYPE sumOverI = 0.0;
            for(int i = 0; i < kStateCount; i++) {
                sumOverI += freqs[i] * integrationTmp[u];
                u++;
            }

            if (scalingFactorsIndices[0] != BEAGLE_OP_NONE) {
                int cumulativeScalingFactorIndex;
                cumulativeScalingFactorIndex = scalingFactorsIndices[subsetIndex];

                const REALTYPE* cumulativeScaleFactors = gScaleBuffers[cumulativeScalingFactorIndex];

                if (subsetIndex == 0) {
                    indexMaxScale[k] = 0;
                    maxScaleFactor[k] = cumulativeScaleFactors[k];
                    for (int j = 1; j < count; j++) {
                        REALTYPE tmpScaleFactor;
                        tmpScaleFactor = gScaleBuffers[scalingFactorsIndices[j]][k];

                        if (tmpScaleFactor > maxScaleFactor[k]) {
                            indexMaxScale[k] = j;
                            maxScaleFactor[k] = tmpScaleFactor;
                        }
                    }
                }

                if (subsetIndex != indexMaxScale[k])
                    sumOverI *= exp((REALTYPE)(cumulativeScaleFactors[k] - maxScaleFactor[k]));
            }



            if (subsetIndex == 0) {
                outLogLikelihoodsTmp[k] = sumOverI;
            } else if (subsetIndex == count - 1) {
                REALTYPE tmpSum = outLogLikelihoodsTmp[k] + sumOverI;

                outLogLikelihoodsTmp[k] = log(tmpSum);
            } else {
                outLogLikelihoodsTmp[k] += sumOverI;
            }

        }

    }

    if (scalingFactorsIndices[0] != BEAGLE_OP_NONE) {
        for(int i=0; i<kPatternCount; i++)
            outLogLikelihoodsTmp[i] += maxScaleFactor[i];
    }


    *outSumLogLikelihood = 0.0;
    for (int i = 0; i < kPatternCount; i++) {
        *outSumLogLikelihood += outLogLikelihoodsTmp[i] * gPatternWeights[i];
    }

    if (*outSumLogLikelihood != *outSumLogLikelihood)
        returnCode = BEAGLE_ERROR_FLOATING_POINT;

    return returnCode;
}